

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

vector<mg_server_port,_std::allocator<mg_server_port>_> * __thiscall
CivetServer::getListeningPortsFull
          (vector<mg_server_port,_std::allocator<mg_server_port>_> *__return_storage_ptr__,
          CivetServer *this)

{
  mg_context *ctx;
  size_type sVar1;
  reference ports;
  int local_68;
  int size;
  allocator<mg_server_port> local_1a;
  undefined1 local_19;
  CivetServer *local_18;
  CivetServer *this_local;
  vector<mg_server_port,_std::allocator<mg_server_port>_> *server_ports;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CivetServer *)__return_storage_ptr__;
  std::allocator<mg_server_port>::allocator(&local_1a);
  std::vector<mg_server_port,_std::allocator<mg_server_port>_>::vector
            (__return_storage_ptr__,8,&local_1a);
  std::allocator<mg_server_port>::~allocator(&local_1a);
  while( true ) {
    ctx = this->context;
    sVar1 = std::vector<mg_server_port,_std::allocator<mg_server_port>_>::size
                      (__return_storage_ptr__);
    ports = std::vector<mg_server_port,_std::allocator<mg_server_port>_>::operator[]
                      (__return_storage_ptr__,0);
    local_68 = mg_get_server_ports(ctx,(int)sVar1,ports);
    sVar1 = std::vector<mg_server_port,_std::allocator<mg_server_port>_>::size
                      (__return_storage_ptr__);
    if (local_68 < (int)sVar1) break;
    sVar1 = std::vector<mg_server_port,_std::allocator<mg_server_port>_>::size
                      (__return_storage_ptr__);
    std::vector<mg_server_port,_std::allocator<mg_server_port>_>::resize
              (__return_storage_ptr__,sVar1 * 2);
  }
  if (local_68 < 0) {
    local_68 = 0;
  }
  std::vector<mg_server_port,_std::allocator<mg_server_port>_>::resize
            (__return_storage_ptr__,(long)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<struct mg_server_port>
CivetServer::getListeningPortsFull()
{
	std::vector<struct mg_server_port> server_ports(8);
	for (;;) {
		int size = mg_get_server_ports(context,
		                               static_cast<int>(server_ports.size()),
		                               &server_ports[0]);
		if (size < static_cast<int>(server_ports.size())) {
			server_ports.resize(size < 0 ? 0 : size);
			break;
		}
		server_ports.resize(server_ports.size() * 2);
	}
	return server_ports;
}